

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpacceptor.cpp
# Opt level: O3

void __thiscall TCPAcceptor::~TCPAcceptor(TCPAcceptor *this)

{
  pointer pcVar1;
  
  if (0 < this->m_lsd) {
    close(this->m_lsd);
  }
  pcVar1 = (this->m_address)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_address).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

TCPAcceptor::~TCPAcceptor()
{
    if (m_lsd > 0) {
        close(m_lsd);
    }
}